

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::InspectInstrForMemCopyCandidate
          (GlobOpt *this,Loop *loop,Instr *instr,MemCopyEmitData *emitData,bool *errorInInstr)

{
  OpCode OVar1;
  undefined2 other;
  Opnd *pOVar2;
  code *pcVar3;
  GlobOpt *pGVar4;
  bool bVar5;
  OpndKind OVar6;
  bool bVar7;
  BailOutKind BVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  StackSym *pSVar12;
  JITTimeFunctionBody *pJVar13;
  FunctionJITTimeInfo *pFVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  IndirOpnd *pIVar17;
  SymID SVar18;
  char16_t *form;
  MemOpCandidate *pMVar19;
  wchar local_4a8 [4];
  char16 ldValueTypeStr [256];
  char16 debugStringBuffer [42];
  wchar local_a8 [4];
  char16 debugStringBuffer_1 [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType stValueType;
  ValueType ldValueType;
  
  unique0x10000dc3 = this;
  if (((emitData == (MemCopyEmitData *)0x0) ||
      (pMVar19 = (emitData->super_MemOpEmitData).candidate, pMVar19 == (MemOpCandidate *)0x0)) ||
     (pMVar19->type != MEMCOPY)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4472,
                       "(emitData && emitData->candidate && emitData->candidate->IsMemCopy())",
                       "emitData && emitData->candidate && emitData->candidate->IsMemCopy()");
    if (!bVar5) goto LAB_0046e2fa;
    *puVar11 = 0;
    pMVar19 = (emitData->super_MemOpEmitData).candidate;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == LdElemI_A) {
    if (((emitData->super_MemOpEmitData).stElemInstr != (Instr *)0x0) &&
       (OVar6 = IR::Opnd::GetKind(instr->m_src1), OVar6 == OpndKindIndir)) {
      pOVar2 = instr->m_src1;
      OVar6 = IR::Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar5) goto LAB_0046e2fa;
        *puVar11 = 0;
      }
      pSVar12 = IR::Opnd::GetStackSym((Opnd *)pOVar2[1]._vptr_Opnd);
      SVar18 = 0xffffffff;
      if ((pSVar12 != (StackSym *)0x0) &&
         ((pSVar12->m_type == TyVar ||
          (pSVar12 = StackSym::GetVarEquivSym(pSVar12,(Func *)0x0), pSVar12 != (StackSym *)0x0)))) {
        SVar18 = (pSVar12->super_Sym).m_id;
      }
      if (SVar18 == pMVar19[1].base) {
        pOVar2 = instr->m_src1;
        OVar6 = IR::Opnd::GetKind(pOVar2);
        if (OVar6 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar5) goto LAB_0046e2fa;
          *puVar11 = 0;
        }
        pSVar12 = IR::Opnd::GetStackSym(*(Opnd **)&pOVar2[1].m_valueType);
        SVar18 = 0xffffffff;
        if ((pSVar12 != (StackSym *)0x0) &&
           ((pSVar12->m_type == TyVar ||
            (pSVar12 = StackSym::GetVarEquivSym(pSVar12,(Func *)0x0), pSVar12 != (StackSym *)0x0))))
        {
          SVar18 = (pSVar12->super_Sym).m_id;
        }
        if (SVar18 == pMVar19->index) {
          if (instr->m_kind != InstrKindProfiled) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x448e,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
            if (!bVar5) goto LAB_0046e2fa;
            *puVar11 = 0;
          }
          emitData->ldElemInstr = instr;
          pIVar17 = IR::Opnd::AsIndirOpnd(((emitData->super_MemOpEmitData).stElemInstr)->m_dst);
          local_34 = (pIVar17->m_baseOpnd->super_Opnd).m_valueType.field_0;
          pIVar17 = IR::Opnd::AsIndirOpnd(emitData->ldElemInstr->m_src1);
          other = (pIVar17->m_baseOpnd->super_Opnd).m_valueType;
          local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)other;
          bVar5 = ValueType::operator!=((ValueType *)&local_34.field_0,(ValueType)other);
          pGVar4 = stack0xffffffffffffffb0;
          if (!bVar5) goto LAB_0046e167;
          ValueType::ToString((ValueType *)&local_34.field_0,
                              (wchar (*) [256])(ldValueTypeStr + 0xfc));
          ValueType::ToString((ValueType *)&local_32[0].field_0,(wchar (*) [256])local_4a8);
          if (DAT_015bc46a == '\x01') {
            pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pGVar4->func->m_workItem);
            uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
            pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
            uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
            bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar9,uVar10);
            if (!bVar7) {
              pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pGVar4->func->m_workItem);
              uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
              pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
              uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
              bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar9,uVar10);
              if (!bVar7) goto LAB_0046e160;
            }
            Output::Print(L"TRACE MemCopy:");
            pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pGVar4->func->m_workItem);
            pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar13);
            pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
            pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_a8);
            uVar9 = Loop::GetLoopNumber(loop);
            Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar15,pcVar16,(ulong)uVar9);
            Output::Print(L"for mismatch in Load(%s) and Store(%s) value type",local_4a8,
                          ldValueTypeStr + 0xfc);
            IR::Instr::DumpByteCodeOffset(instr);
            pcVar15 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
            Output::Print(L" (%s)",pcVar15);
            Output::Print(L"\n");
            Output::Flush();
          }
LAB_0046e160:
          *errorInInstr = true;
LAB_0046e167:
          return !bVar5;
        }
      }
    }
    pGVar4 = stack0xffffffffffffffb0;
    if (DAT_015bc46a != '\x01') goto LAB_0046e2db;
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(stack0xffffffffffffffb0->func->m_workItem);
    uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar9,uVar10);
    if (!bVar5) {
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pGVar4->func->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
      pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar9,uVar10);
      if (!bVar5) goto LAB_0046e2db;
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pGVar4->func->m_workItem);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar14,(wchar (*) [42])(ldValueTypeStr + 0xfc));
    uVar9 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar15,pcVar16,(ulong)uVar9);
    form = L"Orphan LdElemI_A detected";
  }
  else {
    if ((OVar1 != StElemI_A_Strict) && (OVar1 != StElemI_A)) {
      return false;
    }
    OVar6 = IR::Opnd::GetKind(instr->m_dst);
    if (OVar6 == OpndKindIndir) {
      pOVar2 = instr->m_dst;
      OVar6 = IR::Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar5) goto LAB_0046e2fa;
        *puVar11 = 0;
      }
      pSVar12 = IR::Opnd::GetStackSym((Opnd *)pOVar2[1]._vptr_Opnd);
      SVar18 = 0xffffffff;
      if ((pSVar12 != (StackSym *)0x0) &&
         ((pSVar12->m_type == TyVar ||
          (pSVar12 = StackSym::GetVarEquivSym(pSVar12,(Func *)0x0), pSVar12 != (StackSym *)0x0)))) {
        SVar18 = (pSVar12->super_Sym).m_id;
      }
      if (SVar18 == pMVar19->base) {
        pOVar2 = instr->m_dst;
        OVar6 = IR::Opnd::GetKind(pOVar2);
        if (OVar6 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar5) goto LAB_0046e2fa;
          *puVar11 = 0;
        }
        pSVar12 = IR::Opnd::GetStackSym(*(Opnd **)&pOVar2[1].m_valueType);
        SVar18 = 0xffffffff;
        if ((pSVar12 != (StackSym *)0x0) &&
           ((pSVar12->m_type == TyVar ||
            (pSVar12 = StackSym::GetVarEquivSym(pSVar12,(Func *)0x0), pSVar12 != (StackSym *)0x0))))
        {
          SVar18 = (pSVar12->super_Sym).m_id;
        }
        if (SVar18 == pMVar19->index) {
          if (instr->m_kind != InstrKindProfiled) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x447c,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
            if (!bVar5) {
LAB_0046e2fa:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar11 = 0;
          }
          (emitData->super_MemOpEmitData).stElemInstr = instr;
          BVar8 = IR::Instr::GetBailOutKind(instr);
          (emitData->super_MemOpEmitData).bailOutKind = BVar8;
          return false;
        }
      }
    }
    pGVar4 = stack0xffffffffffffffb0;
    if (DAT_015bc46a != '\x01') goto LAB_0046e2db;
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(stack0xffffffffffffffb0->func->m_workItem);
    uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar9,uVar10);
    if (!bVar5) {
      pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pGVar4->func->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
      pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemCopyPhase,uVar9,uVar10);
      if (!bVar5) goto LAB_0046e2db;
    }
    Output::Print(L"TRACE MemCopy:");
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(pGVar4->func->m_workItem);
    pcVar15 = JITTimeFunctionBody::GetDisplayName(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar14,(wchar (*) [42])(ldValueTypeStr + 0xfc));
    uVar9 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar15,pcVar16,(ulong)uVar9);
    form = L"Orphan StElemI_A detected";
  }
  Output::Print(form);
  IR::Instr::DumpByteCodeOffset(instr);
  pcVar15 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
  Output::Print(L" (%s)",pcVar15);
  Output::Print(L"\n");
  Output::Flush();
LAB_0046e2db:
  *errorInInstr = true;
  return false;
}

Assistant:

bool
GlobOpt::InspectInstrForMemCopyCandidate(Loop* loop, IR::Instr* instr, MemCopyEmitData* emitData, bool& errorInInstr)
{
    Assert(emitData && emitData->candidate && emitData->candidate->IsMemCopy());
    Loop::MemCopyCandidate* candidate = (Loop::MemCopyCandidate*)emitData->candidate;
    if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
    {
        if (
            instr->GetDst()->IsIndirOpnd() &&
            (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->base) &&
            (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->stElemInstr = instr;
            emitData->bailOutKind = instr->GetBailOutKind();
            // Still need to find the LdElem
            return false;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Orphan StElemI_A detected"));
        errorInInstr = true;
    }
    else if (instr->m_opcode == Js::OpCode::LdElemI_A)
    {
        if (
            emitData->stElemInstr &&
            instr->GetSrc1()->IsIndirOpnd() &&
            (GetVarSymID(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->ldBase) &&
            (GetVarSymID(instr->GetSrc1()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->ldElemInstr = instr;
            ValueType stValueType = emitData->stElemInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType();
            ValueType ldValueType = emitData->ldElemInstr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType();
            if (stValueType != ldValueType)
            {
#if DBG_DUMP
                char16 stValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                stValueType.ToString(stValueTypeStr);
                char16 ldValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                ldValueType.ToString(ldValueTypeStr);
                TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("for mismatch in Load(%s) and Store(%s) value type"), ldValueTypeStr, stValueTypeStr);
#endif
                errorInInstr = true;
                return false;
            }
            // We found both instruction for this candidate
            return true;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, instr, _u("Orphan LdElemI_A detected"));
        errorInInstr = true;
    }
    return false;
}